

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int ref_match_found_in_nb_blocks(MB_MODE_INFO *cur_mbmi,MB_MODE_INFO *nb_mbmi)

{
  int iVar1;
  long lVar2;
  MV_REFERENCE_FRAME cur_ref_frames [2];
  
  cur_ref_frames[0] = cur_mbmi->ref_frame[0];
  cur_ref_frames[1] = cur_mbmi->ref_frame[1];
  iVar1 = 0;
  for (lVar2 = 0; (ulong)('\0' < cur_mbmi->ref_frame[1]) + 1 != lVar2; lVar2 = lVar2 + 1) {
    if (cur_ref_frames[lVar2] == nb_mbmi->ref_frame[1]) {
      iVar1 = 1;
    }
    if (cur_ref_frames[lVar2] == nb_mbmi->ref_frame[0]) {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static inline int ref_match_found_in_nb_blocks(MB_MODE_INFO *cur_mbmi,
                                               MB_MODE_INFO *nb_mbmi) {
  MV_REFERENCE_FRAME nb_ref_frames[2] = { nb_mbmi->ref_frame[0],
                                          nb_mbmi->ref_frame[1] };
  MV_REFERENCE_FRAME cur_ref_frames[2] = { cur_mbmi->ref_frame[0],
                                           cur_mbmi->ref_frame[1] };
  const int is_cur_comp_pred = has_second_ref(cur_mbmi);
  int match_found = 0;

  for (int i = 0; i < (is_cur_comp_pred + 1); i++) {
    if ((cur_ref_frames[i] == nb_ref_frames[0]) ||
        (cur_ref_frames[i] == nb_ref_frames[1]))
      match_found = 1;
  }
  return match_found;
}